

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long in_RDX;
  long in_RSI;
  int overflow;
  int ret;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  secp256k1_scalar *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_40;
  uint local_4;
  
  iVar4 = 0;
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88);
    local_4 = 0;
  }
  else {
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffffa0,(uchar *)0x0,
               (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    uVar1 = secp256k1_scalar_set_b32_seckey
                      ((secp256k1_scalar *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (uchar *)in_stack_ffffffffffffff88);
    uVar2 = (uint)((iVar4 != 0 ^ 0xffU) & 1);
    uVar3 = secp256k1_eckey_privkey_tweak_mul
                      ((secp256k1_scalar *)
                       (ulong)((CONCAT14(iVar4 != 0,in_stack_ffffffffffffff90) ^ 0xff00000000) &
                              0x1ffffffff),in_stack_ffffffffffffff88);
    uVar1 = uVar2 & uVar3 & uVar1;
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)&stack0xffffffffffffffa0,&secp256k1_scalar_zero,
               (uint)((uVar1 != 0 ^ 0xffU) & 1));
    secp256k1_scalar_get_b32
              ((uchar *)CONCAT44(uVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88);
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffa0);
    secp256k1_scalar_clear(&local_40);
    local_4 = uVar1;
  }
  return local_4;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}